

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cnn_test.cc
# Opt level: O0

void __thiscall
CNNTest_TestVaryingStridesVaryingDimImages_Test::TestBody
          (CNNTest_TestVaryingStridesVaryingDimImages_Test *this)

{
  float expected_4 [16];
  float expected_3 [18];
  float expected_2 [12];
  CNN_THREAD_DATA thread_data;
  float expected_1 [12];
  float input [408];
  int image_width;
  int image_height;
  CNN_CONFIG cnn_config;
  float bias [1];
  float weights [44];
  undefined1 *local_26c0;
  undefined1 local_26b8 [64];
  undefined1 local_2678 [80];
  undefined1 local_2628 [48];
  undefined8 local_25f8;
  undefined8 local_25f0;
  undefined1 local_25e8 [48];
  undefined1 local_25b8 [1632];
  undefined4 local_1f58;
  undefined4 local_1f54;
  undefined4 local_1f50 [6];
  undefined4 local_1f38;
  undefined4 local_1f34;
  undefined4 local_1f30;
  undefined4 local_1f2c;
  undefined4 local_1f28;
  undefined4 local_1f24;
  undefined1 *local_1f18;
  undefined4 *local_1f10;
  undefined1 local_1f08;
  undefined1 local_1f07;
  undefined1 local_1efc;
  undefined1 local_1efb;
  undefined1 auStackY_1ec0 [168];
  double in_stack_ffffffffffffe1e8;
  int in_stack_ffffffffffffe1f4;
  CNN_CONFIG *in_stack_ffffffffffffe1f8;
  float *in_stack_ffffffffffffe200;
  float *in_stack_ffffffffffffe208;
  int in_stack_ffffffffffffe210;
  int in_stack_ffffffffffffe214;
  CNN_THREAD_DATA *in_stack_ffffffffffffe220;
  undefined1 auStack_c0 [4];
  undefined4 local_bc;
  undefined1 local_b8 [184];
  
  memcpy(local_b8,&DAT_018a46d0,0xb0);
  local_bc = 0x40000000;
  memset(local_1f50,0,0x1e90);
  local_1f50[0] = 1;
  local_1f38 = 1;
  local_1f34 = 4;
  local_1f30 = 0xb;
  local_1f2c = 1;
  local_1f28 = 7;
  local_1f24 = 6;
  local_1f18 = local_b8;
  local_1f10 = &local_bc;
  local_1f08 = 0;
  local_1f07 = 0;
  local_1efc = 0;
  local_1efb = 0;
  local_26c0 = auStackY_1ec0;
  do {
    local_26c0 = local_26c0 + 0x78;
  } while (local_26c0 != auStack_c0);
  local_1f54 = 0x18;
  local_1f58 = 0x11;
  memcpy(local_25b8,&DAT_018a4780,0x660);
  memcpy(local_25e8,&DAT_018a4de0,0x30);
  local_25f8 = 1;
  local_25f0 = 0;
  anon_unknown.dwarf_30f402::CNNTest::RunCNNTest
            (in_stack_ffffffffffffe214,in_stack_ffffffffffffe210,in_stack_ffffffffffffe208,
             in_stack_ffffffffffffe200,in_stack_ffffffffffffe1f8,in_stack_ffffffffffffe1f4,
             in_stack_ffffffffffffe220,in_stack_ffffffffffffe1e8);
  local_1f28 = 6;
  local_1f24 = 7;
  memcpy(local_2628,&DAT_018a4e10,0x30);
  anon_unknown.dwarf_30f402::CNNTest::RunCNNTest
            (in_stack_ffffffffffffe214,in_stack_ffffffffffffe210,in_stack_ffffffffffffe208,
             in_stack_ffffffffffffe200,in_stack_ffffffffffffe1f8,in_stack_ffffffffffffe1f4,
             in_stack_ffffffffffffe220,in_stack_ffffffffffffe1e8);
  local_1f28 = 3;
  local_1f24 = 10;
  memcpy(local_2678,&DAT_018a4e40,0x48);
  anon_unknown.dwarf_30f402::CNNTest::RunCNNTest
            (in_stack_ffffffffffffe214,in_stack_ffffffffffffe210,in_stack_ffffffffffffe208,
             in_stack_ffffffffffffe200,in_stack_ffffffffffffe1f8,in_stack_ffffffffffffe1f4,
             in_stack_ffffffffffffe220,in_stack_ffffffffffffe1e8);
  local_1f28 = 10;
  local_1f24 = 3;
  memcpy(local_26b8,&DAT_018a4e90,0x40);
  anon_unknown.dwarf_30f402::CNNTest::RunCNNTest
            (in_stack_ffffffffffffe214,in_stack_ffffffffffffe210,in_stack_ffffffffffffe208,
             in_stack_ffffffffffffe200,in_stack_ffffffffffffe1f8,in_stack_ffffffffffffe1f4,
             in_stack_ffffffffffffe220,in_stack_ffffffffffffe1e8);
  return;
}

Assistant:

TEST_F(CNNTest, TestVaryingStridesVaryingDimImages) {
  float weights[] = {
    1,  -5, -3, -4, -1, 1,  2,  -3, 2,  2,  -1, 1,  -5, 1,  1,
    -3, -5, 3,  1,  4,  -2, -5, -2, -3, -5, 0,  -1, -5, 2,  -2,
    -2, 1,  -2, -4, 1,  3,  -2, 2,  0,  -3, 2,  -3, -2, -3,
  };
  float bias[] = { 2 };

  CNN_CONFIG cnn_config = { 1,
                            0,
                            0,
                            0,
                            0,
                            {
                                {
                                    1,
                                    4,
                                    11,
                                    1,
                                    7,
                                    6,
                                    0,
                                    weights,
                                    bias,
                                    PADDING_SAME_ZERO,
                                    NONE,
                                    0,
                                    0,
                                    BRANCH_NO_COPY,
                                    BRANCH_NOC,
                                    {},
                                    {},
                                    0,
                                },
                            } };

  int image_height = 24;
  int image_width = 17;
  float input[] = {
    -1, -3, 4,  4,  -5, 4,  3,  -5, -1, -3, 4,  -4, 2,  -3, 3,  -5, 2,  -1, -5,
    1,  -1, 3,  1,  -3, -3, 4,  0,  2,  -3, -5, -5, -4, 0,  -5, -2, -3, -1, -2,
    2,  -5, 4,  4,  0,  -4, -3, 1,  -3, -5, -4, -4, 1,  -2, -3, 3,  -3, -3, -1,
    -5, -5, -2, 3,  1,  -1, -5, -5, 1,  -4, -2, -1, -2, -4, -4, 2,  -2, 2,  1,
    -2, -4, -1, 1,  -2, -5, 3,  -2, -1, -1, -5, -3, 1,  -2, -2, -3, -1, -2, -4,
    -2, 1,  -4, -1, 4,  3,  -4, 0,  4,  2,  2,  4,  -3, -5, 2,  2,  1,  -1, -4,
    -2, 1,  3,  2,  0,  4,  -1, -3, 2,  1,  -4, 2,  2,  -4, -2, 0,  -2, -1, 4,
    4,  2,  3,  -4, 2,  -4, -5, 4,  -1, -3, -1, 0,  -4, 1,  3,  -1, -3, -5, 3,
    -2, -4, 1,  2,  -2, -3, -3, -5, 1,  -3, -1, 0,  -1, 3,  -4, -1, -5, -5, 1,
    0,  0,  -2, -2, 2,  -2, 0,  0,  2,  0,  -3, 0,  -1, -4, -4, -1, 3,  -4, -4,
    -1, 0,  -5, -3, -2, 4,  -3, -4, -4, 0,  -5, 1,  -2, -3, -3, -4, 4,  3,  4,
    3,  3,  -1, 3,  1,  -3, -2, 3,  3,  0,  2,  -4, -3, 2,  2,  0,  -2, 4,  -2,
    2,  -2, -1, -4, -2, 2,  -4, 3,  -1, 4,  1,  1,  4,  -1, -4, -4, 1,  1,  -2,
    4,  -1, 3,  2,  -3, 4,  3,  1,  4,  0,  -4, 2,  0,  2,  4,  -2, -2, 4,  2,
    -1, -2, 1,  -3, 2,  3,  -5, -3, 4,  4,  2,  -5, -4, -5, -2, -4, 2,  0,  2,
    -5, 4,  -4, -2, -5, 2,  1,  0,  4,  1,  -2, -3, -4, -3, -4, 3,  3,  2,  0,
    -3, 1,  -5, 4,  0,  4,  -1, 3,  -5, -5, -2, -1, -1, 4,  3,  3,  4,  3,  -4,
    4,  -3, -3, -1, -4, -1, -4, -1, -2, 4,  -2, -4, 4,  4,  -3, -4, -1, 1,  2,
    -1, -2, -2, 3,  2,  2,  -3, 0,  -1, 0,  3,  2,  -5, 0,  -4, 0,  0,  2,  -4,
    -1, -1, 0,  -2, 0,  1,  0,  0,  4,  -5, -1, -5, 2,  -1, 0,  2,  -1, 1,  3,
    -3, -5, -2, -3, 4,  -2, -2, -1, -3, -4, -1, -2, -4, 1,  4,  -3, -2, -1, 3,
    -3, -2, 3,  2,  1,  -4, -3, -5, 1,
  };
  float expected_1[] = {
    41, -26, 5, 76, 13, 83, -21, 53, -54, -14, 21, 121,
  };

  CNN_THREAD_DATA thread_data = { 1, nullptr };

  RunCNNTest(image_width, image_height, input, expected_1, &cnn_config,
             image_width, &thread_data, MSE_INT_TOL);

  cnn_config.layer_config[0].skip_width = 6;
  cnn_config.layer_config[0].skip_height = 7;

  float expected_2[] = {
    21, -50, 41, 20, 72, 127, -21, 103, 62, -37, 83, -3,
  };
  RunCNNTest(image_width, image_height, input, expected_2, &cnn_config,
             image_width, &thread_data, MSE_INT_TOL);

  cnn_config.layer_config[0].skip_width = 3;
  cnn_config.layer_config[0].skip_height = 10;

  float expected_3[] = {
    -26, -21, -35, 69, 49,  4,  -51, -43, -56,
    -41, 15,  -44, 40, -62, 63, 38,  27,  47,
  };
  RunCNNTest(image_width, image_height, input, expected_3, &cnn_config,
             image_width, &thread_data, MSE_INT_TOL);

  cnn_config.layer_config[0].skip_width = 10;
  cnn_config.layer_config[0].skip_height = 3;

  float expected_4[] = {
    21, 49, 28, 87, 50, 40, 102, 81, 58, 85, 51, 66, 36, 19, -37, -45,
  };

  RunCNNTest(image_width, image_height, input, expected_4, &cnn_config,
             image_width, &thread_data, MSE_INT_TOL);
}